

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::avx::
     BVHNIntersectorKHybrid<8,_4,_1,_true,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::TriangleMvIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  int iVar2;
  undefined4 uVar3;
  Scene *pSVar4;
  Geometry *pGVar5;
  RTCFilterFunctionN p_Var6;
  ulong uVar7;
  float fVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  uint uVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  NodeRef *pNVar21;
  ulong uVar22;
  size_t sVar23;
  ulong uVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  float fVar29;
  float fVar30;
  float fVar39;
  float fVar40;
  undefined1 auVar31 [16];
  float fVar42;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float fVar41;
  float fVar43;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  float fVar53;
  float fVar63;
  undefined1 auVar54 [16];
  float fVar64;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  float fVar61;
  float fVar62;
  undefined1 auVar60 [64];
  float fVar65;
  undefined1 auVar66 [16];
  float fVar75;
  undefined1 auVar67 [16];
  float fVar72;
  float fVar74;
  float fVar76;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  float fVar71;
  float fVar73;
  undefined1 auVar70 [64];
  float fVar77;
  float fVar84;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  float fVar82;
  float fVar83;
  undefined1 auVar81 [64];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [64];
  float fVar88;
  float fVar97;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  float fVar95;
  float fVar96;
  undefined1 auVar94 [64];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [64];
  float fVar101;
  float fVar102;
  undefined1 auVar103 [16];
  float fVar114;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  float fVar111;
  float fVar113;
  float fVar115;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  float fVar110;
  float fVar112;
  undefined1 auVar109 [64];
  float fVar116;
  float fVar118;
  float fVar119;
  float fVar120;
  undefined1 auVar117 [64];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [64];
  float fVar125;
  float fVar127;
  float fVar128;
  float fVar129;
  undefined1 auVar126 [64];
  float fVar130;
  float fVar132;
  float fVar133;
  float fVar134;
  undefined1 auVar131 [64];
  float fVar135;
  float fVar136;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  undefined1 auVar137 [16];
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  NodeRef *local_1600;
  long local_15d0;
  undefined1 local_1568 [16];
  undefined1 (*local_1558) [16];
  long local_1550;
  RTCFilterFunctionNArguments args;
  undefined1 local_1428 [16];
  undefined1 local_1418 [16];
  undefined1 local_1408 [16];
  undefined1 local_13f8 [16];
  undefined1 local_13e8 [16];
  undefined1 local_13d8 [16];
  RTCHitN local_13c8 [16];
  undefined1 local_13b8 [16];
  undefined1 local_13a8 [16];
  undefined4 local_1398;
  undefined4 uStack_1394;
  undefined4 uStack_1390;
  undefined4 uStack_138c;
  undefined1 local_1388 [16];
  undefined1 local_1378 [16];
  undefined1 local_1368 [16];
  uint local_1358;
  uint uStack_1354;
  uint uStack_1350;
  uint uStack_134c;
  uint uStack_1348;
  uint uStack_1344;
  uint uStack_1340;
  uint uStack_133c;
  undefined1 local_1338 [32];
  undefined1 local_1318 [32];
  undefined1 local_12f8 [32];
  undefined1 local_12d8 [32];
  undefined1 local_12b8 [32];
  undefined1 local_1298 [32];
  undefined1 local_1278 [32];
  undefined1 local_1258 [32];
  undefined1 local_1238 [32];
  undefined1 local_1218 [32];
  undefined1 local_11f8 [32];
  NodeRef stack [564];
  
  stack[0] = root;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_11f8._4_4_ = uVar1;
  local_11f8._0_4_ = uVar1;
  local_11f8._8_4_ = uVar1;
  local_11f8._12_4_ = uVar1;
  local_11f8._16_4_ = uVar1;
  local_11f8._20_4_ = uVar1;
  local_11f8._24_4_ = uVar1;
  local_11f8._28_4_ = uVar1;
  auVar81 = ZEXT3264(local_11f8);
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_1218._4_4_ = uVar1;
  local_1218._0_4_ = uVar1;
  local_1218._8_4_ = uVar1;
  local_1218._12_4_ = uVar1;
  local_1218._16_4_ = uVar1;
  local_1218._20_4_ = uVar1;
  local_1218._24_4_ = uVar1;
  local_1218._28_4_ = uVar1;
  auVar87 = ZEXT3264(local_1218);
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_1238._4_4_ = uVar1;
  local_1238._0_4_ = uVar1;
  local_1238._8_4_ = uVar1;
  local_1238._12_4_ = uVar1;
  local_1238._16_4_ = uVar1;
  local_1238._20_4_ = uVar1;
  local_1238._24_4_ = uVar1;
  local_1238._28_4_ = uVar1;
  auVar94 = ZEXT3264(local_1238);
  fVar29 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar39 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar40 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar25 = ZEXT416((uint)(fVar29 * 0.99999964));
  auVar25 = vshufps_avx(auVar25,auVar25,0);
  local_1258._16_16_ = auVar25;
  local_1258._0_16_ = auVar25;
  auVar100 = ZEXT3264(local_1258);
  auVar25 = ZEXT416((uint)(fVar39 * 0.99999964));
  auVar25 = vshufps_avx(auVar25,auVar25,0);
  local_1278._16_16_ = auVar25;
  local_1278._0_16_ = auVar25;
  auVar70 = ZEXT3264(local_1278);
  auVar25 = ZEXT416((uint)(fVar40 * 0.99999964));
  auVar25 = vshufps_avx(auVar25,auVar25,0);
  local_1298._16_16_ = auVar25;
  local_1298._0_16_ = auVar25;
  auVar109 = ZEXT3264(local_1298);
  auVar25 = ZEXT416((uint)(fVar29 * 1.0000004));
  auVar25 = vshufps_avx(auVar25,auVar25,0);
  local_12b8._16_16_ = auVar25;
  local_12b8._0_16_ = auVar25;
  auVar117 = ZEXT3264(local_12b8);
  auVar25 = ZEXT416((uint)(fVar39 * 1.0000004));
  auVar25 = vshufps_avx(auVar25,auVar25,0);
  local_12d8._16_16_ = auVar25;
  local_12d8._0_16_ = auVar25;
  auVar124 = ZEXT3264(local_12d8);
  auVar25 = ZEXT416((uint)(fVar40 * 1.0000004));
  auVar25 = vshufps_avx(auVar25,auVar25,0);
  local_12f8._16_16_ = auVar25;
  local_12f8._0_16_ = auVar25;
  auVar60 = ZEXT3264(local_12f8);
  uVar22 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar19 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar24 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar2 = (tray->tnear).field_0.i[k];
  local_1318._4_4_ = iVar2;
  local_1318._0_4_ = iVar2;
  local_1318._8_4_ = iVar2;
  local_1318._12_4_ = iVar2;
  local_1318._16_4_ = iVar2;
  local_1318._20_4_ = iVar2;
  local_1318._24_4_ = iVar2;
  local_1318._28_4_ = iVar2;
  auVar126 = ZEXT3264(local_1318);
  iVar2 = (tray->tfar).field_0.i[k];
  local_1338._4_4_ = iVar2;
  local_1338._0_4_ = iVar2;
  local_1338._8_4_ = iVar2;
  local_1338._12_4_ = iVar2;
  local_1338._16_4_ = iVar2;
  local_1338._20_4_ = iVar2;
  local_1338._24_4_ = iVar2;
  local_1338._28_4_ = iVar2;
  auVar131 = ZEXT3264(local_1338);
  local_1558 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_1600 = stack + 1;
LAB_00fdd44c:
  do {
    pNVar21 = local_1600;
    if (pNVar21 == stack) {
LAB_00fdde07:
      return pNVar21 != stack;
    }
    local_1600 = pNVar21 + -1;
    sVar23 = pNVar21[-1].ptr;
    while ((sVar23 & 8) == 0) {
      auVar9 = vsubps_avx(*(undefined1 (*) [32])(sVar23 + 0x40 + uVar22),auVar81._0_32_);
      auVar10._4_4_ = auVar100._4_4_ * auVar9._4_4_;
      auVar10._0_4_ = auVar100._0_4_ * auVar9._0_4_;
      auVar10._8_4_ = auVar100._8_4_ * auVar9._8_4_;
      auVar10._12_4_ = auVar100._12_4_ * auVar9._12_4_;
      auVar10._16_4_ = auVar100._16_4_ * auVar9._16_4_;
      auVar10._20_4_ = auVar100._20_4_ * auVar9._20_4_;
      auVar10._24_4_ = auVar100._24_4_ * auVar9._24_4_;
      auVar10._28_4_ = auVar9._28_4_;
      auVar9 = vsubps_avx(*(undefined1 (*) [32])(sVar23 + 0x40 + uVar19),auVar87._0_32_);
      auVar11._4_4_ = auVar70._4_4_ * auVar9._4_4_;
      auVar11._0_4_ = auVar70._0_4_ * auVar9._0_4_;
      auVar11._8_4_ = auVar70._8_4_ * auVar9._8_4_;
      auVar11._12_4_ = auVar70._12_4_ * auVar9._12_4_;
      auVar11._16_4_ = auVar70._16_4_ * auVar9._16_4_;
      auVar11._20_4_ = auVar70._20_4_ * auVar9._20_4_;
      auVar11._24_4_ = auVar70._24_4_ * auVar9._24_4_;
      auVar11._28_4_ = auVar9._28_4_;
      auVar9 = vmaxps_avx(auVar10,auVar11);
      auVar10 = vsubps_avx(*(undefined1 (*) [32])(sVar23 + 0x40 + uVar24),auVar94._0_32_);
      auVar12._4_4_ = auVar109._4_4_ * auVar10._4_4_;
      auVar12._0_4_ = auVar109._0_4_ * auVar10._0_4_;
      auVar12._8_4_ = auVar109._8_4_ * auVar10._8_4_;
      auVar12._12_4_ = auVar109._12_4_ * auVar10._12_4_;
      auVar12._16_4_ = auVar109._16_4_ * auVar10._16_4_;
      auVar12._20_4_ = auVar109._20_4_ * auVar10._20_4_;
      auVar12._24_4_ = auVar109._24_4_ * auVar10._24_4_;
      auVar12._28_4_ = auVar10._28_4_;
      auVar10 = vmaxps_avx(auVar12,auVar126._0_32_);
      auVar9 = vmaxps_avx(auVar9,auVar10);
      auVar10 = vsubps_avx(*(undefined1 (*) [32])(sVar23 + 0x40 + (uVar22 ^ 0x20)),auVar81._0_32_);
      auVar13._4_4_ = auVar117._4_4_ * auVar10._4_4_;
      auVar13._0_4_ = auVar117._0_4_ * auVar10._0_4_;
      auVar13._8_4_ = auVar117._8_4_ * auVar10._8_4_;
      auVar13._12_4_ = auVar117._12_4_ * auVar10._12_4_;
      auVar13._16_4_ = auVar117._16_4_ * auVar10._16_4_;
      auVar13._20_4_ = auVar117._20_4_ * auVar10._20_4_;
      auVar13._24_4_ = auVar117._24_4_ * auVar10._24_4_;
      auVar13._28_4_ = auVar10._28_4_;
      auVar10 = vsubps_avx(*(undefined1 (*) [32])(sVar23 + 0x40 + (uVar19 ^ 0x20)),auVar87._0_32_);
      auVar14._4_4_ = auVar124._4_4_ * auVar10._4_4_;
      auVar14._0_4_ = auVar124._0_4_ * auVar10._0_4_;
      auVar14._8_4_ = auVar124._8_4_ * auVar10._8_4_;
      auVar14._12_4_ = auVar124._12_4_ * auVar10._12_4_;
      auVar14._16_4_ = auVar124._16_4_ * auVar10._16_4_;
      auVar14._20_4_ = auVar124._20_4_ * auVar10._20_4_;
      auVar14._24_4_ = auVar124._24_4_ * auVar10._24_4_;
      auVar14._28_4_ = auVar10._28_4_;
      auVar10 = vminps_avx(auVar13,auVar14);
      auVar11 = vsubps_avx(*(undefined1 (*) [32])(sVar23 + 0x40 + (uVar24 ^ 0x20)),auVar94._0_32_);
      auVar15._4_4_ = auVar60._4_4_ * auVar11._4_4_;
      auVar15._0_4_ = auVar60._0_4_ * auVar11._0_4_;
      auVar15._8_4_ = auVar60._8_4_ * auVar11._8_4_;
      auVar15._12_4_ = auVar60._12_4_ * auVar11._12_4_;
      auVar15._16_4_ = auVar60._16_4_ * auVar11._16_4_;
      auVar15._20_4_ = auVar60._20_4_ * auVar11._20_4_;
      auVar15._24_4_ = auVar60._24_4_ * auVar11._24_4_;
      auVar15._28_4_ = auVar11._28_4_;
      auVar11 = vminps_avx(auVar15,auVar131._0_32_);
      auVar10 = vminps_avx(auVar10,auVar11);
      auVar9 = vcmpps_avx(auVar9,auVar10,2);
      uVar16 = vmovmskps_avx(auVar9);
      if (uVar16 == 0) goto LAB_00fdd44c;
      uVar16 = uVar16 & 0xff;
      uVar17 = sVar23 & 0xfffffffffffffff0;
      lVar18 = 0;
      if (uVar16 != 0) {
        for (; (uVar16 >> lVar18 & 1) == 0; lVar18 = lVar18 + 1) {
        }
      }
      sVar23 = *(size_t *)(uVar17 + lVar18 * 8);
      uVar16 = uVar16 - 1 & uVar16;
      uVar20 = (ulong)uVar16;
      if (uVar16 != 0) {
        do {
          local_1600->ptr = sVar23;
          local_1600 = local_1600 + 1;
          lVar18 = 0;
          if (uVar20 != 0) {
            for (; (uVar20 >> lVar18 & 1) == 0; lVar18 = lVar18 + 1) {
            }
          }
          sVar23 = *(size_t *)(uVar17 + lVar18 * 8);
          uVar20 = uVar20 - 1 & uVar20;
        } while (uVar20 != 0);
      }
    }
    local_1550 = (ulong)((uint)sVar23 & 0xf) - 8;
    uVar17 = sVar23 & 0xfffffffffffffff0;
    for (local_15d0 = 0; local_15d0 != local_1550; local_15d0 = local_15d0 + 1) {
      lVar18 = local_15d0 * 0xb0;
      uVar1 = *(undefined4 *)(ray + k * 4);
      auVar31._4_4_ = uVar1;
      auVar31._0_4_ = uVar1;
      auVar31._8_4_ = uVar1;
      auVar31._12_4_ = uVar1;
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x10);
      auVar44._4_4_ = uVar1;
      auVar44._0_4_ = uVar1;
      auVar44._8_4_ = uVar1;
      auVar44._12_4_ = uVar1;
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x20);
      auVar66._4_4_ = uVar1;
      auVar66._0_4_ = uVar1;
      auVar66._8_4_ = uVar1;
      auVar66._12_4_ = uVar1;
      auVar25 = vsubps_avx(*(undefined1 (*) [16])(uVar17 + lVar18),auVar31);
      auVar28 = vsubps_avx(*(undefined1 (*) [16])(uVar17 + 0x10 + lVar18),auVar44);
      auVar33 = vsubps_avx(*(undefined1 (*) [16])(uVar17 + 0x20 + lVar18),auVar66);
      auVar45 = vsubps_avx(*(undefined1 (*) [16])(uVar17 + 0x30 + lVar18),auVar31);
      auVar46 = vsubps_avx(*(undefined1 (*) [16])(uVar17 + 0x40 + lVar18),auVar44);
      auVar55 = vsubps_avx(*(undefined1 (*) [16])(uVar17 + 0x50 + lVar18),auVar66);
      auVar31 = vsubps_avx(*(undefined1 (*) [16])(uVar17 + 0x60 + lVar18),auVar31);
      auVar44 = vsubps_avx(*(undefined1 (*) [16])(uVar17 + 0x70 + lVar18),auVar44);
      auVar66 = vsubps_avx(*(undefined1 (*) [16])(uVar17 + 0x80 + lVar18),auVar66);
      auVar54 = vsubps_avx(auVar31,auVar25);
      auVar68 = vsubps_avx(auVar44,auVar28);
      auVar32 = vsubps_avx(auVar66,auVar33);
      fVar53 = auVar28._0_4_;
      fVar29 = fVar53 + auVar44._0_4_;
      fVar61 = auVar28._4_4_;
      fVar39 = fVar61 + auVar44._4_4_;
      fVar62 = auVar28._8_4_;
      fVar40 = fVar62 + auVar44._8_4_;
      fVar63 = auVar28._12_4_;
      fVar42 = fVar63 + auVar44._12_4_;
      fVar135 = auVar33._0_4_;
      fVar65 = fVar135 + auVar66._0_4_;
      fVar138 = auVar33._4_4_;
      fVar71 = fVar138 + auVar66._4_4_;
      fVar140 = auVar33._8_4_;
      fVar73 = fVar140 + auVar66._8_4_;
      fVar142 = auVar33._12_4_;
      fVar75 = fVar142 + auVar66._12_4_;
      fVar30 = auVar32._0_4_;
      auVar103._0_4_ = fVar29 * fVar30;
      fVar41 = auVar32._4_4_;
      auVar103._4_4_ = fVar39 * fVar41;
      fVar43 = auVar32._8_4_;
      auVar103._8_4_ = fVar40 * fVar43;
      fVar8 = auVar32._12_4_;
      auVar103._12_4_ = fVar42 * fVar8;
      fVar144 = auVar68._0_4_;
      auVar121._0_4_ = fVar144 * fVar65;
      fVar145 = auVar68._4_4_;
      auVar121._4_4_ = fVar145 * fVar71;
      fVar146 = auVar68._8_4_;
      auVar121._8_4_ = fVar146 * fVar73;
      fVar147 = auVar68._12_4_;
      auVar121._12_4_ = fVar147 * fVar75;
      auVar68 = vsubps_avx(auVar121,auVar103);
      fVar88 = auVar25._0_4_;
      fVar101 = fVar88 + auVar31._0_4_;
      fVar95 = auVar25._4_4_;
      fVar110 = fVar95 + auVar31._4_4_;
      fVar96 = auVar25._8_4_;
      fVar112 = fVar96 + auVar31._8_4_;
      fVar97 = auVar25._12_4_;
      fVar114 = fVar97 + auVar31._12_4_;
      fVar125 = auVar54._0_4_;
      auVar67._0_4_ = fVar125 * fVar65;
      fVar127 = auVar54._4_4_;
      auVar67._4_4_ = fVar127 * fVar71;
      fVar128 = auVar54._8_4_;
      auVar67._8_4_ = fVar128 * fVar73;
      fVar129 = auVar54._12_4_;
      auVar67._12_4_ = fVar129 * fVar75;
      auVar122._0_4_ = fVar101 * fVar30;
      auVar122._4_4_ = fVar110 * fVar41;
      auVar122._8_4_ = fVar112 * fVar43;
      auVar122._12_4_ = fVar114 * fVar8;
      auVar54 = vsubps_avx(auVar122,auVar67);
      auVar104._0_4_ = fVar101 * fVar144;
      auVar104._4_4_ = fVar110 * fVar145;
      auVar104._8_4_ = fVar112 * fVar146;
      auVar104._12_4_ = fVar114 * fVar147;
      auVar32._0_4_ = fVar125 * fVar29;
      auVar32._4_4_ = fVar127 * fVar39;
      auVar32._8_4_ = fVar128 * fVar40;
      auVar32._12_4_ = fVar129 * fVar42;
      auVar32 = vsubps_avx(auVar32,auVar104);
      fVar29 = *(float *)(ray + k * 4 + 0x60);
      fVar39 = *(float *)(ray + k * 4 + 0x50);
      fVar40 = *(float *)(ray + k * 4 + 0x40);
      auVar123._0_4_ = fVar40 * auVar68._0_4_ + fVar29 * auVar32._0_4_ + fVar39 * auVar54._0_4_;
      auVar123._4_4_ = fVar40 * auVar68._4_4_ + fVar29 * auVar32._4_4_ + fVar39 * auVar54._4_4_;
      auVar123._8_4_ = fVar40 * auVar68._8_4_ + fVar29 * auVar32._8_4_ + fVar39 * auVar54._8_4_;
      auVar123._12_4_ = fVar40 * auVar68._12_4_ + fVar29 * auVar32._12_4_ + fVar39 * auVar54._12_4_;
      auVar28 = vsubps_avx(auVar28,auVar46);
      auVar33 = vsubps_avx(auVar33,auVar55);
      fVar75 = auVar46._0_4_ + fVar53;
      fVar101 = auVar46._4_4_ + fVar61;
      fVar110 = auVar46._8_4_ + fVar62;
      fVar112 = auVar46._12_4_ + fVar63;
      fVar114 = fVar135 + auVar55._0_4_;
      fVar72 = fVar138 + auVar55._4_4_;
      fVar74 = fVar140 + auVar55._8_4_;
      fVar76 = fVar142 + auVar55._12_4_;
      fVar42 = auVar33._0_4_;
      auVar137._0_4_ = fVar75 * fVar42;
      fVar65 = auVar33._4_4_;
      auVar137._4_4_ = fVar101 * fVar65;
      fVar71 = auVar33._8_4_;
      auVar137._8_4_ = fVar110 * fVar71;
      fVar73 = auVar33._12_4_;
      auVar137._12_4_ = fVar112 * fVar73;
      fVar130 = auVar28._0_4_;
      auVar54._0_4_ = fVar130 * fVar114;
      fVar132 = auVar28._4_4_;
      auVar54._4_4_ = fVar132 * fVar72;
      fVar133 = auVar28._8_4_;
      auVar54._8_4_ = fVar133 * fVar74;
      fVar134 = auVar28._12_4_;
      auVar54._12_4_ = fVar134 * fVar76;
      auVar28 = vsubps_avx(auVar54,auVar137);
      auVar25 = vsubps_avx(auVar25,auVar45);
      fVar116 = auVar25._0_4_;
      auVar68._0_4_ = fVar116 * fVar114;
      fVar118 = auVar25._4_4_;
      auVar68._4_4_ = fVar118 * fVar72;
      fVar119 = auVar25._8_4_;
      auVar68._8_4_ = fVar119 * fVar74;
      fVar120 = auVar25._12_4_;
      auVar68._12_4_ = fVar120 * fVar76;
      fVar114 = auVar45._0_4_ + fVar88;
      fVar72 = auVar45._4_4_ + fVar95;
      fVar74 = auVar45._8_4_ + fVar96;
      fVar76 = auVar45._12_4_ + fVar97;
      auVar105._0_4_ = fVar114 * fVar42;
      auVar105._4_4_ = fVar72 * fVar65;
      auVar105._8_4_ = fVar74 * fVar71;
      auVar105._12_4_ = fVar76 * fVar73;
      auVar25 = vsubps_avx(auVar105,auVar68);
      auVar89._0_4_ = fVar130 * fVar114;
      auVar89._4_4_ = fVar132 * fVar72;
      auVar89._8_4_ = fVar133 * fVar74;
      auVar89._12_4_ = fVar134 * fVar76;
      auVar33._0_4_ = fVar116 * fVar75;
      auVar33._4_4_ = fVar118 * fVar101;
      auVar33._8_4_ = fVar119 * fVar110;
      auVar33._12_4_ = fVar120 * fVar112;
      auVar33 = vsubps_avx(auVar33,auVar89);
      auVar69._0_4_ = fVar40 * auVar28._0_4_ + fVar29 * auVar33._0_4_ + fVar39 * auVar25._0_4_;
      auVar69._4_4_ = fVar40 * auVar28._4_4_ + fVar29 * auVar33._4_4_ + fVar39 * auVar25._4_4_;
      auVar69._8_4_ = fVar40 * auVar28._8_4_ + fVar29 * auVar33._8_4_ + fVar39 * auVar25._8_4_;
      auVar69._12_4_ = fVar40 * auVar28._12_4_ + fVar29 * auVar33._12_4_ + fVar39 * auVar25._12_4_;
      auVar25 = vsubps_avx(auVar45,auVar31);
      fVar72 = auVar45._0_4_ + auVar31._0_4_;
      fVar74 = auVar45._4_4_ + auVar31._4_4_;
      fVar76 = auVar45._8_4_ + auVar31._8_4_;
      fVar64 = auVar45._12_4_ + auVar31._12_4_;
      auVar28 = vsubps_avx(auVar46,auVar44);
      fVar77 = auVar46._0_4_ + auVar44._0_4_;
      fVar82 = auVar46._4_4_ + auVar44._4_4_;
      fVar83 = auVar46._8_4_ + auVar44._8_4_;
      fVar84 = auVar46._12_4_ + auVar44._12_4_;
      auVar33 = vsubps_avx(auVar55,auVar66);
      fVar101 = auVar55._0_4_ + auVar66._0_4_;
      fVar110 = auVar55._4_4_ + auVar66._4_4_;
      fVar112 = auVar55._8_4_ + auVar66._8_4_;
      fVar114 = auVar55._12_4_ + auVar66._12_4_;
      fVar136 = auVar33._0_4_;
      auVar90._0_4_ = fVar136 * fVar77;
      fVar139 = auVar33._4_4_;
      auVar90._4_4_ = fVar139 * fVar82;
      fVar141 = auVar33._8_4_;
      auVar90._8_4_ = fVar141 * fVar83;
      fVar143 = auVar33._12_4_;
      auVar90._12_4_ = fVar143 * fVar84;
      fVar102 = auVar28._0_4_;
      auVar98._0_4_ = fVar102 * fVar101;
      fVar111 = auVar28._4_4_;
      auVar98._4_4_ = fVar111 * fVar110;
      fVar113 = auVar28._8_4_;
      auVar98._8_4_ = fVar113 * fVar112;
      fVar115 = auVar28._12_4_;
      auVar98._12_4_ = fVar115 * fVar114;
      auVar28 = vsubps_avx(auVar98,auVar90);
      fVar75 = auVar25._0_4_;
      auVar45._0_4_ = fVar75 * fVar101;
      fVar101 = auVar25._4_4_;
      auVar45._4_4_ = fVar101 * fVar110;
      fVar110 = auVar25._8_4_;
      auVar45._8_4_ = fVar110 * fVar112;
      fVar112 = auVar25._12_4_;
      auVar45._12_4_ = fVar112 * fVar114;
      auVar25._0_4_ = fVar136 * fVar72;
      auVar25._4_4_ = fVar139 * fVar74;
      auVar25._8_4_ = fVar141 * fVar76;
      auVar25._12_4_ = fVar143 * fVar64;
      auVar25 = vsubps_avx(auVar25,auVar45);
      auVar55._0_4_ = fVar102 * fVar72;
      auVar55._4_4_ = fVar111 * fVar74;
      auVar55._8_4_ = fVar113 * fVar76;
      auVar55._12_4_ = fVar115 * fVar64;
      auVar78._0_4_ = fVar75 * fVar77;
      auVar78._4_4_ = fVar101 * fVar82;
      auVar78._8_4_ = fVar110 * fVar83;
      auVar78._12_4_ = fVar112 * fVar84;
      auVar33 = vsubps_avx(auVar78,auVar55);
      auVar46._0_4_ = fVar40 * auVar28._0_4_ + fVar29 * auVar33._0_4_ + fVar39 * auVar25._0_4_;
      auVar46._4_4_ = fVar40 * auVar28._4_4_ + fVar29 * auVar33._4_4_ + fVar39 * auVar25._4_4_;
      auVar46._8_4_ = fVar40 * auVar28._8_4_ + fVar29 * auVar33._8_4_ + fVar39 * auVar25._8_4_;
      auVar46._12_4_ = fVar40 * auVar28._12_4_ + fVar29 * auVar33._12_4_ + fVar39 * auVar25._12_4_;
      auVar99._0_4_ = auVar46._0_4_ + auVar123._0_4_ + auVar69._0_4_;
      auVar99._4_4_ = auVar46._4_4_ + auVar123._4_4_ + auVar69._4_4_;
      auVar99._8_4_ = auVar46._8_4_ + auVar123._8_4_ + auVar69._8_4_;
      auVar99._12_4_ = auVar46._12_4_ + auVar123._12_4_ + auVar69._12_4_;
      auVar25 = vminps_avx(auVar123,auVar69);
      auVar28 = vminps_avx(auVar25,auVar46);
      auVar106._8_4_ = 0x7fffffff;
      auVar106._0_8_ = 0x7fffffff7fffffff;
      auVar106._12_4_ = 0x7fffffff;
      auVar25 = vandps_avx(auVar99,auVar106);
      auVar79._0_4_ = auVar25._0_4_ * 1.1920929e-07;
      auVar79._4_4_ = auVar25._4_4_ * 1.1920929e-07;
      auVar79._8_4_ = auVar25._8_4_ * 1.1920929e-07;
      auVar79._12_4_ = auVar25._12_4_ * 1.1920929e-07;
      uVar20 = CONCAT44(auVar79._4_4_,auVar79._0_4_);
      auVar91._0_8_ = uVar20 ^ 0x8000000080000000;
      auVar91._8_4_ = -auVar79._8_4_;
      auVar91._12_4_ = -auVar79._12_4_;
      auVar28 = vcmpps_avx(auVar28,auVar91,5);
      auVar33 = vmaxps_avx(auVar123,auVar69);
      auVar33 = vmaxps_avx(auVar33,auVar46);
      auVar33 = vcmpps_avx(auVar33,auVar79,2);
      auVar28 = vorps_avx(auVar28,auVar33);
      if ((((auVar28 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar28 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar28 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar28[0xf] < '\0'
         ) {
        auVar47._0_4_ = fVar30 * fVar130;
        auVar47._4_4_ = fVar41 * fVar132;
        auVar47._8_4_ = fVar43 * fVar133;
        auVar47._12_4_ = fVar8 * fVar134;
        auVar56._0_4_ = fVar42 * fVar144;
        auVar56._4_4_ = fVar65 * fVar145;
        auVar56._8_4_ = fVar71 * fVar146;
        auVar56._12_4_ = fVar73 * fVar147;
        auVar46 = vsubps_avx(auVar56,auVar47);
        auVar80._0_4_ = fVar42 * fVar102;
        auVar80._4_4_ = fVar65 * fVar111;
        auVar80._8_4_ = fVar71 * fVar113;
        auVar80._12_4_ = fVar73 * fVar115;
        auVar92._0_4_ = fVar136 * fVar130;
        auVar92._4_4_ = fVar139 * fVar132;
        auVar92._8_4_ = fVar141 * fVar133;
        auVar92._12_4_ = fVar143 * fVar134;
        auVar55 = vsubps_avx(auVar92,auVar80);
        auVar33 = vandps_avx(auVar106,auVar47);
        auVar45 = vandps_avx(auVar106,auVar80);
        auVar33 = vcmpps_avx(auVar33,auVar45,1);
        local_13f8 = vblendvps_avx(auVar55,auVar46,auVar33);
        auVar48._0_4_ = fVar116 * fVar136;
        auVar48._4_4_ = fVar118 * fVar139;
        auVar48._8_4_ = fVar119 * fVar141;
        auVar48._12_4_ = fVar120 * fVar143;
        auVar57._0_4_ = fVar116 * fVar30;
        auVar57._4_4_ = fVar118 * fVar41;
        auVar57._8_4_ = fVar119 * fVar43;
        auVar57._12_4_ = fVar120 * fVar8;
        auVar85._0_4_ = fVar42 * fVar125;
        auVar85._4_4_ = fVar65 * fVar127;
        auVar85._8_4_ = fVar71 * fVar128;
        auVar85._12_4_ = fVar73 * fVar129;
        auVar46 = vsubps_avx(auVar57,auVar85);
        auVar93._0_4_ = fVar42 * fVar75;
        auVar93._4_4_ = fVar65 * fVar101;
        auVar93._8_4_ = fVar71 * fVar110;
        auVar93._12_4_ = fVar73 * fVar112;
        auVar55 = vsubps_avx(auVar93,auVar48);
        auVar33 = vandps_avx(auVar106,auVar85);
        auVar45 = vandps_avx(auVar106,auVar48);
        auVar33 = vcmpps_avx(auVar33,auVar45,1);
        local_13e8 = vblendvps_avx(auVar55,auVar46,auVar33);
        auVar34._0_4_ = fVar130 * fVar75;
        auVar34._4_4_ = fVar132 * fVar101;
        auVar34._8_4_ = fVar133 * fVar110;
        auVar34._12_4_ = fVar134 * fVar112;
        auVar49._0_4_ = fVar125 * fVar130;
        auVar49._4_4_ = fVar127 * fVar132;
        auVar49._8_4_ = fVar128 * fVar133;
        auVar49._12_4_ = fVar129 * fVar134;
        auVar58._0_4_ = fVar116 * fVar144;
        auVar58._4_4_ = fVar118 * fVar145;
        auVar58._8_4_ = fVar119 * fVar146;
        auVar58._12_4_ = fVar120 * fVar147;
        auVar26._0_4_ = fVar116 * fVar102;
        auVar26._4_4_ = fVar118 * fVar111;
        auVar26._8_4_ = fVar119 * fVar113;
        auVar26._12_4_ = fVar120 * fVar115;
        auVar46 = vsubps_avx(auVar49,auVar58);
        auVar55 = vsubps_avx(auVar26,auVar34);
        auVar33 = vandps_avx(auVar106,auVar58);
        auVar45 = vandps_avx(auVar106,auVar34);
        auVar33 = vcmpps_avx(auVar33,auVar45,1);
        local_13d8 = vblendvps_avx(auVar55,auVar46,auVar33);
        fVar30 = local_13f8._0_4_ * fVar40 + local_13d8._0_4_ * fVar29 + local_13e8._0_4_ * fVar39;
        fVar42 = local_13f8._4_4_ * fVar40 + local_13d8._4_4_ * fVar29 + local_13e8._4_4_ * fVar39;
        fVar41 = local_13f8._8_4_ * fVar40 + local_13d8._8_4_ * fVar29 + local_13e8._8_4_ * fVar39;
        fVar29 = local_13f8._12_4_ * fVar40 +
                 local_13d8._12_4_ * fVar29 + local_13e8._12_4_ * fVar39;
        auVar50._0_4_ = fVar30 + fVar30;
        auVar50._4_4_ = fVar42 + fVar42;
        auVar50._8_4_ = fVar41 + fVar41;
        auVar50._12_4_ = fVar29 + fVar29;
        fVar42 = local_13f8._0_4_ * fVar88 + local_13d8._0_4_ * fVar135 + local_13e8._0_4_ * fVar53;
        fVar41 = local_13f8._4_4_ * fVar95 + local_13d8._4_4_ * fVar138 + local_13e8._4_4_ * fVar61;
        fVar65 = local_13f8._8_4_ * fVar96 + local_13d8._8_4_ * fVar140 + local_13e8._8_4_ * fVar62;
        fVar43 = local_13f8._12_4_ * fVar97 +
                 local_13d8._12_4_ * fVar142 + local_13e8._12_4_ * fVar63;
        auVar33 = vrcpps_avx(auVar50);
        fVar29 = auVar33._0_4_;
        auVar86._0_4_ = auVar50._0_4_ * fVar29;
        fVar39 = auVar33._4_4_;
        auVar86._4_4_ = auVar50._4_4_ * fVar39;
        fVar40 = auVar33._8_4_;
        auVar86._8_4_ = auVar50._8_4_ * fVar40;
        fVar30 = auVar33._12_4_;
        auVar86._12_4_ = auVar50._12_4_ * fVar30;
        auVar107._8_4_ = 0x3f800000;
        auVar107._0_8_ = 0x3f8000003f800000;
        auVar107._12_4_ = 0x3f800000;
        auVar33 = vsubps_avx(auVar107,auVar86);
        local_1408._0_4_ = (fVar42 + fVar42) * (fVar29 + fVar29 * auVar33._0_4_);
        local_1408._4_4_ = (fVar41 + fVar41) * (fVar39 + fVar39 * auVar33._4_4_);
        local_1408._8_4_ = (fVar65 + fVar65) * (fVar40 + fVar40 * auVar33._8_4_);
        local_1408._12_4_ = (fVar43 + fVar43) * (fVar30 + fVar30 * auVar33._12_4_);
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x30);
        auVar59._4_4_ = uVar1;
        auVar59._0_4_ = uVar1;
        auVar59._8_4_ = uVar1;
        auVar59._12_4_ = uVar1;
        auVar33 = vcmpps_avx(auVar59,local_1408,2);
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar108._4_4_ = uVar1;
        auVar108._0_4_ = uVar1;
        auVar108._8_4_ = uVar1;
        auVar108._12_4_ = uVar1;
        auVar60 = ZEXT1664(auVar108);
        auVar45 = vcmpps_avx(local_1408,auVar108,2);
        auVar33 = vandps_avx(auVar45,auVar33);
        auVar45 = auVar28 & auVar33;
        if ((((auVar45 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar45 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar45 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar45[0xf] < '\0') {
          auVar28 = vandps_avx(auVar28,auVar33);
          auVar33 = vcmpps_avx(auVar50,_DAT_01f45a50,4);
          auVar28 = vandps_avx(auVar28,auVar33);
          uVar16 = vmovmskps_avx(auVar28);
          if (uVar16 != 0) {
            pSVar4 = context->scene;
            auVar28 = vrcpps_avx(auVar99);
            fVar29 = auVar28._0_4_;
            auVar35._0_4_ = auVar99._0_4_ * fVar29;
            fVar39 = auVar28._4_4_;
            auVar35._4_4_ = auVar99._4_4_ * fVar39;
            fVar40 = auVar28._8_4_;
            auVar35._8_4_ = auVar99._8_4_ * fVar40;
            fVar30 = auVar28._12_4_;
            auVar35._12_4_ = auVar99._12_4_ * fVar30;
            auVar51._8_4_ = 0x3f800000;
            auVar51._0_8_ = 0x3f8000003f800000;
            auVar51._12_4_ = 0x3f800000;
            auVar28 = vsubps_avx(auVar51,auVar35);
            auVar27._0_4_ = fVar29 + fVar29 * auVar28._0_4_;
            auVar27._4_4_ = fVar39 + fVar39 * auVar28._4_4_;
            auVar27._8_4_ = fVar40 + fVar40 * auVar28._8_4_;
            auVar27._12_4_ = fVar30 + fVar30 * auVar28._12_4_;
            auVar36._8_4_ = 0x219392ef;
            auVar36._0_8_ = 0x219392ef219392ef;
            auVar36._12_4_ = 0x219392ef;
            auVar25 = vcmpps_avx(auVar25,auVar36,5);
            auVar25 = vandps_avx(auVar25,auVar27);
            auVar37._0_4_ = auVar123._0_4_ * auVar25._0_4_;
            auVar37._4_4_ = auVar123._4_4_ * auVar25._4_4_;
            auVar37._8_4_ = auVar123._8_4_ * auVar25._8_4_;
            auVar37._12_4_ = auVar123._12_4_ * auVar25._12_4_;
            local_1428 = vminps_avx(auVar37,auVar51);
            auVar28._0_4_ = auVar69._0_4_ * auVar25._0_4_;
            auVar28._4_4_ = auVar69._4_4_ * auVar25._4_4_;
            auVar28._8_4_ = auVar69._8_4_ * auVar25._8_4_;
            auVar28._12_4_ = auVar69._12_4_ * auVar25._12_4_;
            local_1418 = vminps_avx(auVar28,auVar51);
            uVar20 = (ulong)(uVar16 & 0xff);
            do {
              uVar7 = 0;
              if (uVar20 != 0) {
                for (; (uVar20 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
                }
              }
              uVar16 = *(uint *)(lVar18 + uVar17 + 0x90 + uVar7 * 4);
              pGVar5 = (pSVar4->geometries).items[uVar16].ptr;
              if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                   (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_1398 = *(undefined4 *)(local_1428 + uVar7 * 4);
                  uVar1 = *(undefined4 *)(local_1418 + uVar7 * 4);
                  local_1388._4_4_ = uVar1;
                  local_1388._0_4_ = uVar1;
                  local_1388._8_4_ = uVar1;
                  local_1388._12_4_ = uVar1;
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1408 + uVar7 * 4);
                  args.context = context->user;
                  local_1368 = vpshufd_avx(ZEXT416(uVar16),0);
                  uVar1 = *(undefined4 *)(lVar18 + uVar17 + 0xa0 + uVar7 * 4);
                  local_1378._4_4_ = uVar1;
                  local_1378._0_4_ = uVar1;
                  local_1378._8_4_ = uVar1;
                  local_1378._12_4_ = uVar1;
                  uVar1 = *(undefined4 *)(local_13f8 + uVar7 * 4);
                  uVar3 = *(undefined4 *)(local_13e8 + uVar7 * 4);
                  local_13b8._4_4_ = uVar3;
                  local_13b8._0_4_ = uVar3;
                  local_13b8._8_4_ = uVar3;
                  local_13b8._12_4_ = uVar3;
                  uVar3 = *(undefined4 *)(local_13d8 + uVar7 * 4);
                  local_13a8._4_4_ = uVar3;
                  local_13a8._0_4_ = uVar3;
                  local_13a8._8_4_ = uVar3;
                  local_13a8._12_4_ = uVar3;
                  local_13c8[0] = (RTCHitN)(char)uVar1;
                  local_13c8[1] = (RTCHitN)(char)((uint)uVar1 >> 8);
                  local_13c8[2] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                  local_13c8[3] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                  local_13c8[4] = (RTCHitN)(char)uVar1;
                  local_13c8[5] = (RTCHitN)(char)((uint)uVar1 >> 8);
                  local_13c8[6] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                  local_13c8[7] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                  local_13c8[8] = (RTCHitN)(char)uVar1;
                  local_13c8[9] = (RTCHitN)(char)((uint)uVar1 >> 8);
                  local_13c8[10] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                  local_13c8[0xb] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                  local_13c8[0xc] = (RTCHitN)(char)uVar1;
                  local_13c8[0xd] = (RTCHitN)(char)((uint)uVar1 >> 8);
                  local_13c8[0xe] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                  local_13c8[0xf] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                  uStack_1394 = local_1398;
                  uStack_1390 = local_1398;
                  uStack_138c = local_1398;
                  vcmpps_avx(ZEXT1632(local_1368),ZEXT1632(local_1368),0xf);
                  uStack_1354 = (args.context)->instID[0];
                  local_1358 = uStack_1354;
                  uStack_1350 = uStack_1354;
                  uStack_134c = uStack_1354;
                  uStack_1348 = (args.context)->instPrimID[0];
                  uStack_1344 = uStack_1348;
                  uStack_1340 = uStack_1348;
                  uStack_133c = uStack_1348;
                  local_1568 = *local_1558;
                  args.valid = (int *)local_1568;
                  args.geometryUserPtr = pGVar5->userPtr;
                  args.hit = local_13c8;
                  args.N = 4;
                  auVar25 = auVar60._0_16_;
                  args.ray = (RTCRayN *)ray;
                  if (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar5->occlusionFilterN)(&args);
                    auVar60 = ZEXT1664(auVar25);
                  }
                  if (local_1568 == (undefined1  [16])0x0) {
                    auVar25 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                    auVar25 = auVar25 ^ _DAT_01f46b70;
                  }
                  else {
                    p_Var6 = context->args->filter;
                    if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var6)(&args);
                      auVar60 = ZEXT1664(auVar25);
                    }
                    auVar28 = vpcmpeqd_avx(local_1568,_DAT_01f45a50);
                    auVar25 = auVar28 ^ _DAT_01f46b70;
                    auVar52._8_4_ = 0xff800000;
                    auVar52._0_8_ = 0xff800000ff800000;
                    auVar52._12_4_ = 0xff800000;
                    auVar28 = vblendvps_avx(auVar52,*(undefined1 (*) [16])(args.ray + 0x80),auVar28)
                    ;
                    *(undefined1 (*) [16])(args.ray + 0x80) = auVar28;
                  }
                  auVar38._8_8_ = 0x100000001;
                  auVar38._0_8_ = 0x100000001;
                  if ((auVar38 & auVar25) == (undefined1  [16])0x0) {
                    *(int *)(ray + k * 4 + 0x80) = auVar60._0_4_;
                    goto LAB_00fddd24;
                  }
                }
                *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                goto LAB_00fdde07;
              }
LAB_00fddd24:
              uVar20 = uVar20 ^ 1L << (uVar7 & 0x3f);
            } while (uVar20 != 0);
          }
        }
      }
      auVar81 = ZEXT3264(local_11f8);
      auVar87 = ZEXT3264(local_1218);
      auVar94 = ZEXT3264(local_1238);
      auVar100 = ZEXT3264(local_1258);
      auVar70 = ZEXT3264(local_1278);
      auVar109 = ZEXT3264(local_1298);
      auVar117 = ZEXT3264(local_12b8);
      auVar124 = ZEXT3264(local_12d8);
      auVar60 = ZEXT3264(local_12f8);
      auVar126 = ZEXT3264(local_1318);
      auVar131 = ZEXT3264(local_1338);
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }